

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

void gauden_norm_wt_mean(vector_t ***in_mean,vector_t ***wt_mean,float32 ***dnom,uint32 n_mgau,
                        uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  float fVar1;
  uint uVar2;
  float32 *pfVar3;
  vector_t pfVar4;
  vector_t pfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (n_mgau != 0) {
    uVar6 = 0;
    do {
      if (n_feat != 0) {
        uVar7 = 0;
        do {
          if (n_density != 0) {
            uVar9 = 0;
            do {
              pfVar3 = dnom[uVar6][uVar7];
              fVar1 = (float)pfVar3[uVar9];
              if ((fVar1 != 0.0) || (NAN(fVar1))) {
                uVar2 = veclen[uVar7];
                if ((ulong)uVar2 != 0) {
                  pfVar4 = wt_mean[uVar6][uVar7][uVar9];
                  uVar8 = 0;
                  do {
                    pfVar4[uVar8] = pfVar4[uVar8] / (float)pfVar3[uVar9];
                    uVar8 = uVar8 + 1;
                  } while (uVar2 != uVar8);
                }
              }
              else {
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                        ,0x61f,"(mgau= %u, feat= %u, density= %u) never observed\n",
                        uVar6 & 0xffffffff,uVar7 & 0xffffffff,(int)uVar9);
                if (in_mean != (vector_t ***)0x0) {
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0x621,"Copying it from in_mean\n");
                  uVar2 = veclen[uVar7];
                  if ((ulong)uVar2 != 0) {
                    pfVar4 = in_mean[uVar6][uVar7][uVar9];
                    pfVar5 = wt_mean[uVar6][uVar7][uVar9];
                    uVar8 = 0;
                    do {
                      pfVar5[uVar8] = pfVar4[uVar8];
                      uVar8 = uVar8 + 1;
                    } while (uVar2 != uVar8);
                  }
                }
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != n_density);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != n_feat);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != n_mgau);
  }
  return;
}

Assistant:

void
gauden_norm_wt_mean(vector_t ***in_mean,
		    vector_t ***wt_mean,
		    float32 ***dnom,
		    uint32 n_mgau,
		    uint32 n_feat,
		    uint32 n_density,
		    const uint32 *veclen)
{
    uint32 i, j, k, l;

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (dnom[i][j][k] != 0) {
		    for (l = 0; l < veclen[j]; l++) {
			wt_mean[i][j][k][l] /= dnom[i][j][k];
		    }
		}
		else {
		    E_WARN("(mgau= %u, feat= %u, density= %u) never observed\n",
			   i, j, k);
		    if (in_mean) {
			E_INFO("Copying it from in_mean\n");
			for (l = 0; l < veclen[j]; l++) {
			    wt_mean[i][j][k][l] = in_mean[i][j][k][l];
			}
		    }
		}
	    }
	}
    }
}